

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O2

Api RtMidi::getCompiledApiByName(string *name)

{
  bool bVar1;
  
  bVar1 = std::operator==(name,rtmidi_api_names[2][0]);
  return (uint)bVar1 * 2;
}

Assistant:

RtMidi::Api RtMidi :: getCompiledApiByName( const std::string &name )
{
  unsigned int i=0;
  for (i = 0; i < rtmidi_num_compiled_apis; ++i)
    if (name == rtmidi_api_names[rtmidi_compiled_apis[i]][0])
      return rtmidi_compiled_apis[i];
  return RtMidi::UNSPECIFIED;
}